

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

void Abc_NtkDetectClassesTest(Abc_Ntk_t *pNtk,int fSeq,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  void *__ptr;
  int iVar3;
  Vec_Wec_t *__ptr_00;
  long lVar4;
  long lVar5;
  int level;
  ulong uVar6;
  ulong uVar7;
  timespec ts;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (fSeq != 0) {
    Abc_NtkFrameExtend(pNtk);
  }
  __ptr_00 = Abc_NtkDetectFinClasses(pNtk,fVerbose);
  uVar1 = __ptr_00->nSize;
  uVar6 = (ulong)(int)uVar1;
  if ((long)uVar6 < 1) {
    uVar7 = 0;
  }
  else {
    lVar5 = 0;
    uVar7 = 0;
    do {
      uVar7 = (ulong)(((int)uVar7 + *(int *)((long)&__ptr_00->pArray->nSize + lVar5)) - 1);
      lVar5 = lVar5 + 0x10;
    } while (uVar6 << 4 != lVar5);
  }
  printf("Computed %d equivalence classes with %d item pairs.  ",(ulong)uVar1,uVar7);
  level = 3;
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
  if ((fVeryVerbose != 0) && (0 < (int)uVar1)) {
    pVVar2 = __ptr_00->pArray;
    uVar7 = 0;
    do {
      if (pVVar2[uVar7].nSize != 1) {
        printf(" %4d : {",uVar7 & 0xffffffff);
        if (0 < pVVar2[uVar7].nSize) {
          lVar4 = 0;
          do {
            printf(" %d",(ulong)(uint)pVVar2[uVar7].pArray[lVar4]);
            lVar4 = lVar4 + 1;
          } while (lVar4 < pVVar2[uVar7].nSize);
        }
        puts(" }");
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar6);
  }
  iVar3 = __ptr_00->nCap;
  if (0 < (long)iVar3) {
    pVVar2 = __ptr_00->pArray;
    lVar4 = 0;
    do {
      __ptr = *(void **)((long)&pVVar2->pArray + lVar4);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar2->pArray + lVar4) = 0;
      }
      lVar4 = lVar4 + 0x10;
    } while ((long)iVar3 * 0x10 != lVar4);
  }
  if (__ptr_00->pArray != (Vec_Int_t *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (Vec_Int_t *)0x0;
  }
  __ptr_00->nCap = 0;
  __ptr_00->nSize = 0;
  free(__ptr_00);
  return;
}

Assistant:

void Abc_NtkDetectClassesTest( Abc_Ntk_t * pNtk, int fSeq, int fVerbose, int fVeryVerbose )
{
    Vec_Wec_t * vResult;
    abctime clk = Abc_Clock();
    if ( fSeq ) 
        Abc_NtkFrameExtend( pNtk );
    vResult = Abc_NtkDetectFinClasses( pNtk, fVerbose );
    printf( "Computed %d equivalence classes with %d item pairs.  ", Vec_WecSize(vResult), Abc_NtkFinCountPairs(vResult) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVeryVerbose )
        Vec_WecPrint( vResult, 1 );
//    if ( fVerbose )
//        Abc_NtkPrintFinResults( vResult );
    Vec_WecFree( vResult );
}